

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_embedded_expr(CTcEmbedBuilder *b,CTcEmbedTokenList *tl)

{
  undefined1 *puVar1;
  CTcEmbedTokenList *tpl;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsNode *func;
  CTcPrsNode *pCVar3;
  undefined4 extraout_var_00;
  CTPNArglist *arglist;
  CTPNArg *pCVar4;
  CTPNCall *this;
  CTcEmbedTokenList *siz;
  CTcTokenEle **ppCVar5;
  
  ppCVar5 = (CTcTokenEle **)&G_prs->str_template_head_;
  while( true ) {
    tpl = (CTcEmbedTokenList *)*ppCVar5;
    if (tpl == (CTcEmbedTokenList *)0x0) {
      CTcEmbedTokenList::unget(tl,0,0);
      iVar2 = (*b->_vptr_CTcEmbedBuilder[3])(b);
      return (CTcPrsNode *)CONCAT44(extraout_var,iVar2);
    }
    siz = tpl;
    iVar2 = CTcEmbedTokenList::match(tl,(CTcStrTemplate *)tpl);
    if (iVar2 != 0) break;
    ppCVar5 = &tpl[1].wrt;
  }
  func = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)siz);
  func[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = *(_func_int ***)(tpl + 1);
  (func->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00353a00;
  if (*(int *)&tpl->field_0x14 == 0) {
    arglist = (CTPNArglist *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
    iVar2 = 0;
    pCVar4 = (CTPNArg *)0x0;
  }
  else {
    if (tpl->cnt < 2) {
      siz = (CTcEmbedTokenList *)0x0;
      CTcEmbedTokenList::unget(tl,0,0);
      iVar2 = (*b->_vptr_CTcEmbedBuilder[3])(b);
      pCVar3 = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      CTcEmbedTokenList::reduce(tl,(CTcStrTemplate *)tpl);
      pCVar3 = parse_embedded_expr(b,tl);
      siz = tl;
    }
    if (pCVar3 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    arglist = (CTPNArglist *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
    pCVar4 = (CTPNArg *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)siz);
    (pCVar4->super_CTPNArgBase).arg_expr_ = pCVar3;
    (pCVar4->super_CTPNArgBase).next_arg_ = (CTPNArg *)0x0;
    puVar1 = &(pCVar4->super_CTPNArgBase).field_0x40;
    *puVar1 = *puVar1 & 0xfe;
    (pCVar4->super_CTPNArgBase).name_.typ_ = TOKT_INVALID;
    (pCVar4->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00353ed8;
    iVar2 = 1;
  }
  (arglist->super_CTPNArglistBase).argc_ = iVar2;
  (arglist->super_CTPNArglistBase).list_ = pCVar4;
  (arglist->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_0034ce58;
  this = (CTPNCall *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
  CTPNCall::CTPNCall(this,func,arglist);
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_expr(
    CTcEmbedBuilder *b, CTcEmbedTokenList *tl)
{
    /* search for a template for the expression */
    for (CTcStrTemplate *st = G_prs->get_str_template_head() ; st != 0 ;
         st = st->nxt)
    {
        /* check for a match */
        if (tl->match(st))
        {
            /*
             *   This template matches.  Generate the code as a call to the
             *   template's processor function.
             */
            CTPNSymResolved *func = new CTPNSymResolved(st->func);

            /* 
             *   If the template has a '*', the tokens matching the star are
             *   a sub-expression that we evaluate as the argument to the
             *   function.  Otherwise we call it with no arguments. 
             */
            CTPNArglist *arglist;
            if (st->star)
            {
                /* 
                 *   If the template has any fixed tokens, reparse the
                 *   remaining tokens to see if they refer to a new template.
                 *   If the template was just '*', skip this, since we'd just
                 *   find the same match again.  
                 */
                CTcPrsNode *sub;
                if (st->cnt > 1)
                {
                    /* remove the tokens that matched the fixed part */
                    tl->reduce(st);

                    /* reparse as a new embedded expression */
                    sub = parse_embedded_expr(b, tl);
                }
                else
                {
                    /* the template is just '*', so parse a raw expression */
                    tl->unget();
                    sub = b->parse_expr();
                }

                /* if we failed to parse a sub-expression, return failure */
                if (sub == 0)
                    return 0;
                
                /* create the argument list */
                arglist = new CTPNArglist(1, new CTPNArg(sub));
            }
            else
            {
                /* there's no argument list */
                arglist = new CTPNArglist(0, 0);
            }

            /* create and return the call to the template function */
            return new CTPNCall(func, arglist);
        }
    }

    /* 
     *   There's no template, so process it as an ordinary expression.  Put
     *   the captured token list back into the token stream, and parse an
     *   expression node.  
     */
    tl->unget();
    return b->parse_expr();
}